

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapInfo.cpp
# Opt level: O2

bool __thiscall Memory::HeapInfo::AllocatorsAreEmpty(HeapInfo *this)

{
  bool bVar1;
  bool bVar2;
  long lVar3;
  
  lVar3 = 0x78;
  do {
    if (lVar3 + 0x380 == 0xabf8) {
      lVar3 = 0;
      do {
        bVar1 = lVar3 + 0x380 == 0x6900;
        if (bVar1) {
          return bVar1;
        }
        bVar2 = HeapBucketGroup<MediumAllocationBlockAttributes>::AllocatorsAreEmpty
                          ((HeapBucketGroup<MediumAllocationBlockAttributes> *)
                           ((long)&this->mediumHeapBuckets[0].heapBucket.
                                   super_SmallNormalHeapBucketBase<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>_>
                                   .
                                   super_HeapBucketT<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>_>
                                   .super_HeapBucket.heapInfo + lVar3));
        lVar3 = lVar3 + 0x380;
      } while (bVar2);
      return bVar1;
    }
    bVar1 = HeapBucketGroup<SmallAllocationBlockAttributes>::AllocatorsAreEmpty
                      ((HeapBucketGroup<SmallAllocationBlockAttributes> *)
                       ((long)&((HeapInfo *)(&this->smallBlockPageHeapBucketFilter + -0xc))->
                               recycler + lVar3));
    lVar3 = lVar3 + 0x380;
  } while (bVar1);
  return false;
}

Assistant:

bool
HeapInfo::AllocatorsAreEmpty()
{
    for (uint i = 0; i < HeapConstants::BucketCount; i++)
    {
        if (!heapBuckets[i].AllocatorsAreEmpty())
        {
            return false;
        }
    }

#if defined(BUCKETIZE_MEDIUM_ALLOCATIONS) && SMALLBLOCK_MEDIUM_ALLOC
    for (uint i = 0; i < HeapConstants::MediumBucketCount; i++)
    {
        if (!mediumHeapBuckets[i].AllocatorsAreEmpty())
        {
            return false;
        }
    }

#endif

    return true;
}